

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FkLocateIndex(Parse *pParse,Table *pParent,FKey *pFKey,Index **ppIdx,int **paiCol)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  Index *pIVar4;
  int *piVar5;
  char **ppcVar6;
  Column *pCVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uchar *b;
  char *pcVar15;
  int *local_70;
  
  uVar2 = pFKey->nCol;
  uVar11 = (ulong)uVar2;
  pbVar3 = (byte *)pFKey->aCol[0].zCol;
  if (uVar11 == 1) {
    local_70 = (int *)0x0;
    if (-1 < (long)pParent->iPKey) {
      if (pbVar3 == (byte *)0x0) {
        return 0;
      }
      pbVar9 = (byte *)pParent->aCol[pParent->iPKey].zName;
      bVar1 = *pbVar9;
      pbVar8 = pbVar3;
      while ((bVar1 != 0 && (pbVar9 = pbVar9 + 1, ""[bVar1] == ""[*pbVar8]))) {
        pbVar8 = pbVar8 + 1;
        bVar1 = *pbVar9;
      }
      local_70 = (int *)0x0;
      if (""[bVar1] == ""[*pbVar8]) {
        return 0;
      }
    }
  }
  else if (paiCol == (int **)0x0) {
    local_70 = (int *)0x0;
  }
  else {
    local_70 = (int *)sqlite3DbMallocRaw(pParse->db,uVar2 * 4);
    if (local_70 == (int *)0x0) {
      return 1;
    }
    *paiCol = local_70;
  }
  pIVar4 = pParent->pIndex;
  do {
    if (pIVar4 == (Index *)0x0) {
      if (pParse->disableTriggers == '\0') {
        sqlite3ErrorMsg(pParse,"foreign key mismatch - \"%w\" referencing \"%w\"",
                        pFKey->pFrom->zName,pFKey->zTo);
      }
      sqlite3DbFree(pParse->db,local_70);
      return 1;
    }
    if ((uVar2 == pIVar4->nColumn) && (pIVar4->onError != '\0')) {
      if (pbVar3 == (byte *)0x0) {
        if ((pIVar4->field_0x4f & 3) == 2) {
          if (0 < (int)uVar2 && local_70 != (int *)0x0) {
            lVar10 = 0;
            do {
              *(int *)((long)local_70 + lVar10) = (&pFKey->aCol[0].iFrom)[lVar10];
              lVar10 = lVar10 + 4;
            } while (uVar11 << 2 != lVar10);
          }
LAB_0016f373:
          *ppIdx = pIVar4;
          return 0;
        }
      }
      else {
        if ((int)uVar2 < 1) {
          uVar12 = 0;
        }
        else {
          piVar5 = pIVar4->aiColumn;
          ppcVar6 = pIVar4->azColl;
          pCVar7 = pParent->aCol;
          uVar13 = 0;
          do {
            pcVar15 = pCVar7[piVar5[uVar13]].zColl;
            if ((byte *)pcVar15 == (byte *)0x0) {
              pcVar15 = "BINARY";
            }
            pbVar9 = (byte *)ppcVar6[uVar13];
            bVar1 = *pbVar9;
            while ((bVar1 != 0 && (pbVar9 = pbVar9 + 1, ""[bVar1] == ""[(byte)*pcVar15]))) {
              pcVar15 = (char *)((byte *)pcVar15 + 1);
              bVar1 = *pbVar9;
            }
            if (""[bVar1] != ""[(byte)*pcVar15]) goto LAB_0016f2d7;
            uVar14 = 0;
            do {
              pbVar9 = (byte *)pFKey->aCol[uVar14].zCol;
              bVar1 = *pbVar9;
              pbVar8 = (byte *)pCVar7[piVar5[uVar13]].zName;
              while ((bVar1 != 0 && (pbVar9 = pbVar9 + 1, ""[bVar1] == ""[*pbVar8]))) {
                pbVar8 = pbVar8 + 1;
                bVar1 = *pbVar9;
              }
              if (""[bVar1] == ""[*pbVar8]) {
                if (local_70 != (int *)0x0) {
                  local_70[uVar13] = pFKey->aCol[uVar14].iFrom;
                }
                goto LAB_0016f2c4;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar11);
            uVar14 = (ulong)uVar2;
LAB_0016f2c4:
            if ((uint)uVar14 == uVar2) goto LAB_0016f2d7;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
          uVar13 = (ulong)uVar2;
LAB_0016f2d7:
          uVar12 = (uint)uVar13;
        }
        if (uVar12 == uVar2) goto LAB_0016f373;
      }
    }
    pIVar4 = pIVar4->pNext;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3FkLocateIndex(
  Parse *pParse,                  /* Parse context to store any error in */
  Table *pParent,                 /* Parent table of FK constraint pFKey */
  FKey *pFKey,                    /* Foreign key to find index for */
  Index **ppIdx,                  /* OUT: Unique index on parent table */
  int **paiCol                    /* OUT: Map of index columns in pFKey */
){
  Index *pIdx = 0;                    /* Value to return via *ppIdx */
  int *aiCol = 0;                     /* Value to return via *paiCol */
  int nCol = pFKey->nCol;             /* Number of columns in parent key */
  char *zKey = pFKey->aCol[0].zCol;   /* Name of left-most parent key column */

  /* The caller is responsible for zeroing output parameters. */
  assert( ppIdx && *ppIdx==0 );
  assert( !paiCol || *paiCol==0 );
  assert( pParse );

  /* If this is a non-composite (single column) foreign key, check if it 
  ** maps to the INTEGER PRIMARY KEY of table pParent. If so, leave *ppIdx 
  ** and *paiCol set to zero and return early. 
  **
  ** Otherwise, for a composite foreign key (more than one column), allocate
  ** space for the aiCol array (returned via output parameter *paiCol).
  ** Non-composite foreign keys do not require the aiCol array.
  */
  if( nCol==1 ){
    /* The FK maps to the IPK if any of the following are true:
    **
    **   1) There is an INTEGER PRIMARY KEY column and the FK is implicitly 
    **      mapped to the primary key of table pParent, or
    **   2) The FK is explicitly mapped to a column declared as INTEGER
    **      PRIMARY KEY.
    */
    if( pParent->iPKey>=0 ){
      if( !zKey ) return 0;
      if( !sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName, zKey) ) return 0;
    }
  }else if( paiCol ){
    assert( nCol>1 );
    aiCol = (int *)sqlite3DbMallocRaw(pParse->db, nCol*sizeof(int));
    if( !aiCol ) return 1;
    *paiCol = aiCol;
  }

  for(pIdx=pParent->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->nColumn==nCol && pIdx->onError!=OE_None ){ 
      /* pIdx is a UNIQUE index (or a PRIMARY KEY) and has the right number
      ** of columns. If each indexed column corresponds to a foreign key
      ** column of pFKey, then this index is a winner.  */

      if( zKey==0 ){
        /* If zKey is NULL, then this foreign key is implicitly mapped to 
        ** the PRIMARY KEY of table pParent. The PRIMARY KEY index may be 
        ** identified by the test (Index.autoIndex==2).  */
        if( pIdx->autoIndex==2 ){
          if( aiCol ){
            int i;
            for(i=0; i<nCol; i++) aiCol[i] = pFKey->aCol[i].iFrom;
          }
          break;
        }
      }else{
        /* If zKey is non-NULL, then this foreign key was declared to
        ** map to an explicit list of columns in table pParent. Check if this
        ** index matches those columns. Also, check that the index uses
        ** the default collation sequences for each column. */
        int i, j;
        for(i=0; i<nCol; i++){
          int iCol = pIdx->aiColumn[i];     /* Index of column in parent tbl */
          char *zDfltColl;                  /* Def. collation for column */
          char *zIdxCol;                    /* Name of indexed column */

          /* If the index uses a collation sequence that is different from
          ** the default collation sequence for the column, this index is
          ** unusable. Bail out early in this case.  */
          zDfltColl = pParent->aCol[iCol].zColl;
          if( !zDfltColl ){
            zDfltColl = "BINARY";
          }
          if( sqlite3StrICmp(pIdx->azColl[i], zDfltColl) ) break;

          zIdxCol = pParent->aCol[iCol].zName;
          for(j=0; j<nCol; j++){
            if( sqlite3StrICmp(pFKey->aCol[j].zCol, zIdxCol)==0 ){
              if( aiCol ) aiCol[i] = pFKey->aCol[j].iFrom;
              break;
            }
          }
          if( j==nCol ) break;
        }
        if( i==nCol ) break;      /* pIdx is usable */
      }
    }
  }

  if( !pIdx ){
    if( !pParse->disableTriggers ){
      sqlite3ErrorMsg(pParse,
           "foreign key mismatch - \"%w\" referencing \"%w\"",
           pFKey->pFrom->zName, pFKey->zTo);
    }
    sqlite3DbFree(pParse->db, aiCol);
    return 1;
  }

  *ppIdx = pIdx;
  return 0;
}